

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O2

ARMMMUIdx arm_v7m_mmu_idx_for_secstate_and_priv_aarch64
                    (CPUARMState_conflict *env,_Bool secstate,_Bool priv)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  return (int)CONCAT71(in_register_00000011,priv) + (int)CONCAT71(in_register_00000031,secstate) * 4
         + ARMMMUIdx_MUser;
}

Assistant:

ARMMMUIdx arm_v7m_mmu_idx_all(CPUARMState *env,
                              bool secstate, bool priv, bool negpri)
{
    ARMMMUIdx mmu_idx = ARM_MMU_IDX_M;

    if (priv) {
        mmu_idx |= ARM_MMU_IDX_M_PRIV;
    }

    if (negpri) {
        mmu_idx |= ARM_MMU_IDX_M_NEGPRI;
    }

    if (secstate) {
        mmu_idx |= ARM_MMU_IDX_M_S;
    }

    return mmu_idx;
}